

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::proximate(path *p,error_code *ec)

{
  bool bVar1;
  error_code *in_RDX;
  error_code *in_RDI;
  error_code *in_stack_00000018;
  path cp;
  
  current_path(in_RDI);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    path::path((path *)0x1db2a3);
  }
  else {
    proximate((path *)cp._path._M_string_length,(path *)cp._path._0_8_,in_stack_00000018);
  }
  path::~path((path *)0x1db2b5);
  return (path *)in_RDI;
}

Assistant:

GHC_INLINE path proximate(const path& p, std::error_code& ec)
{
    auto cp = current_path(ec);
    if (!ec) {
        return proximate(p, cp, ec);
    }
    return path();
}